

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int geopolyBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint_usage *psVar1;
  ulong uVar2;
  ulong uVar3;
  uchar *puVar4;
  int iVar5;
  
  if (0 < (long)pIdxInfo->nConstraint) {
    puVar4 = &pIdxInfo->aConstraint->usable;
    uVar3 = 0xffffffff;
    uVar2 = 0;
    iVar5 = 0;
    do {
      if (*puVar4 != '\0') {
        if (((sqlite3_index_constraint *)(puVar4 + -5))->iColumn < 0) {
          if (puVar4[-1] == '\x02') {
            pIdxInfo->idxNum = 1;
            pIdxInfo->idxStr = "rowid";
            psVar1 = pIdxInfo->aConstraintUsage;
            psVar1[uVar2].argvIndex = 1;
            psVar1[uVar2].omit = '\x01';
            pIdxInfo->estimatedCost = 30.0;
            pIdxInfo->estimatedRows = 1;
            pIdxInfo->idxFlags = 1;
            return 0;
          }
        }
        else if ((((sqlite3_index_constraint *)(puVar4 + -5))->iColumn == 0) && (0x95 < puVar4[-1]))
        {
          iVar5 = puVar4[-1] - 0x94;
          uVar3 = uVar2 & 0xffffffff;
        }
      }
      uVar2 = uVar2 + 1;
      puVar4 = puVar4 + 0xc;
    } while ((long)pIdxInfo->nConstraint != uVar2);
    if (-1 < (int)uVar3) {
      pIdxInfo->idxNum = iVar5;
      pIdxInfo->idxStr = "rtree";
      psVar1 = pIdxInfo->aConstraintUsage;
      psVar1[uVar3].argvIndex = 1;
      psVar1[uVar3].omit = '\0';
      pIdxInfo->estimatedCost = 300.0;
      pIdxInfo->estimatedRows = 10;
      return 0;
    }
  }
  pIdxInfo->idxNum = 4;
  pIdxInfo->idxStr = "fullscan";
  pIdxInfo->estimatedCost = 3000000.0;
  pIdxInfo->estimatedRows = 100000;
  return 0;
}

Assistant:

static int geopolyBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  int ii;
  int iRowidTerm = -1;
  int iFuncTerm = -1;
  int idxNum = 0;
  (void)tab;

  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];
    if( !p->usable ) continue;
    if( p->iColumn<0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ  ){
      iRowidTerm = ii;
      break;
    }
    if( p->iColumn==0 && p->op>=SQLITE_INDEX_CONSTRAINT_FUNCTION ){
      /* p->op==SQLITE_INDEX_CONSTRAINT_FUNCTION for geopoly_overlap()
      ** p->op==(SQLITE_INDEX_CONTRAINT_FUNCTION+1) for geopoly_within().
      ** See geopolyFindFunction() */
      iFuncTerm = ii;
      idxNum = p->op - SQLITE_INDEX_CONSTRAINT_FUNCTION + 2;
    }
  }

  if( iRowidTerm>=0 ){
    pIdxInfo->idxNum = 1;
    pIdxInfo->idxStr = "rowid";
    pIdxInfo->aConstraintUsage[iRowidTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iRowidTerm].omit = 1;
    pIdxInfo->estimatedCost = 30.0;
    pIdxInfo->estimatedRows = 1;
    pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
    return SQLITE_OK;
  }
  if( iFuncTerm>=0 ){
    pIdxInfo->idxNum = idxNum;
    pIdxInfo->idxStr = "rtree";
    pIdxInfo->aConstraintUsage[iFuncTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iFuncTerm].omit = 0;
    pIdxInfo->estimatedCost = 300.0;
    pIdxInfo->estimatedRows = 10;
    return SQLITE_OK;
  }
  pIdxInfo->idxNum = 4;
  pIdxInfo->idxStr = "fullscan";
  pIdxInfo->estimatedCost = 3000000.0;
  pIdxInfo->estimatedRows = 100000;
  return SQLITE_OK;
}